

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

CBlockIndex * __thiscall
node::BlockManager::GetLastCheckpoint(BlockManager *this,CCheckpointData *data)

{
  long lVar1;
  _Base_ptr p_Var2;
  long lVar3;
  CBlockIndex *pCVar4;
  _Base_ptr p_Var5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var2 = (data->mapCheckpoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var5 = &(data->mapCheckpoints)._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var5 != p_Var2; p_Var5 = (_Base_ptr)std::_Rb_tree_decrement((_Rb_tree_node_base *)p_Var5)) {
    lVar3 = std::_Rb_tree_decrement((_Rb_tree_node_base *)p_Var5);
    pCVar4 = LookupBlockIndex(this,(uint256 *)(lVar3 + 0x24));
    if (pCVar4 != (CBlockIndex *)0x0) goto LAB_0020d32b;
  }
  pCVar4 = (CBlockIndex *)0x0;
LAB_0020d32b:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pCVar4;
  }
  __stack_chk_fail();
}

Assistant:

const CBlockIndex* BlockManager::GetLastCheckpoint(const CCheckpointData& data)
{
    const MapCheckpoints& checkpoints = data.mapCheckpoints;

    for (const MapCheckpoints::value_type& i : checkpoints | std::views::reverse) {
        const uint256& hash = i.second;
        const CBlockIndex* pindex = LookupBlockIndex(hash);
        if (pindex) {
            return pindex;
        }
    }
    return nullptr;
}